

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void ParseGen(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  int iVar1;
  undefined8 in_RAX;
  SFGenList *pSVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar3;
  long lVar4;
  pointer_____offset_0x10___ *ppuVar5;
  uint uVar6;
  WORD x;
  WORD x_1;
  undefined8 uStack_38;
  
  if ((chunklen & 3) == 0) {
    uVar6 = chunklen >> 2;
    uStack_38 = in_RAX;
    if (chunkid == 0x6e656769) {
      if (uVar6 != sf2->InstrBags[(long)sf2->NumInstrBags + -1].GenIndex + 1) goto LAB_00328f48;
      pSVar2 = (SFGenList *)operator_new__((ulong)chunklen);
      sf2->InstrGenerators = pSVar2;
      sf2->NumInstrGenerators = uVar6;
    }
    else {
      if (chunkid != 0x6e656770) {
        __assert_fail("chunkid == ID_igen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/timidity/instrum_sf2.cpp"
                      ,0x241,"void ParseGen(SFFile *, FileReader *, DWORD, DWORD)");
      }
      if (uVar6 != sf2->PresetBags[(long)sf2->NumPresetBags + -1].GenIndex + 1) goto LAB_00328f48;
      pSVar2 = (SFGenList *)operator_new__((ulong)chunklen);
      sf2->PresetGenerators = pSVar2;
      sf2->NumPresetGenerators = uVar6;
    }
    if (chunklen != 0) {
      lVar4 = 0;
      do {
        iVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,(long)&uStack_38 + 4,2);
        if (CONCAT44(extraout_var,iVar1) != 2) {
LAB_00328f2d:
          uVar3 = __cxa_allocate_exception(1);
          ppuVar5 = &CIOErr::typeinfo;
          goto LAB_00328f3e;
        }
        pSVar2[lVar4].Oper = uStack_38._4_2_;
        iVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,(long)&uStack_38 + 6,2);
        if (CONCAT44(extraout_var_00,iVar1) != 2) goto LAB_00328f2d;
        pSVar2[lVar4].field_1.Amount = uStack_38._6_2_;
        lVar4 = lVar4 + 1;
      } while (uVar6 != (uint)lVar4);
    }
    return;
  }
LAB_00328f48:
  uVar3 = __cxa_allocate_exception(1);
  ppuVar5 = &CBadForm::typeinfo;
LAB_00328f3e:
  __cxa_throw(uVar3,ppuVar5,0);
}

Assistant:

static void ParseGen(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFGenList *gens, *gen;
	int numgens;
	int i;

	// Section 7.5, page 24:
	//		If the PGEN sub-chunk is missing, or its size is not a multiple of
	//		four bytes, the file should be rejected as structurally unsound.
	if (chunklen & 3)
	{
		throw CBadForm();
	}
	numgens = chunklen >> 2;

	if (chunkid == ID_pgen)
	{
		// Section 7.3, page 22:
		//		the size of the PGEN sub-chunk in bytes will be equal to four
		//		times the terminal preset�s wGenNdx plus four.
		if (numgens != sf2->PresetBags[sf2->NumPresetBags - 1].GenIndex + 1)
		{
			throw CBadForm();
		}
		sf2->PresetGenerators = gens = new SFGenList[numgens];
		sf2->NumPresetGenerators = numgens;
	}
	else
	{
		assert(chunkid == ID_igen);
		if (numgens != sf2->InstrBags[sf2->NumInstrBags - 1].GenIndex + 1)
		{
			throw CBadForm();
		}
		sf2->InstrGenerators = gens = new SFGenList[numgens];
		sf2->NumInstrGenerators = numgens;
	}
	
	for (i = numgens, gen = gens; i != 0; --i, ++gen)
	{
		gen->Oper = read_uword(f);
		gen->uAmount = read_uword(f);
#ifdef __BIG_ENDIAN__
		if (gen->Oper == GEN_keyRange || gen->Oper == GEN_velRange)
		{
			// Reswap range generators
			gen->uAmount = LittleShort(gen->uAmount);
		}
#endif
	}
}